

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

optional<pbrt::LightLeSample> * __thiscall
pbrt::LightHandle::SampleLe
          (optional<pbrt::LightLeSample> *__return_storage_ptr__,LightHandle *this,Point2f u1,
          Point2f u2,SampledWavelengths *lambda,Float time)

{
  ulong uVar1;
  ushort uVar2;
  ProjectionLight *this_00;
  
  uVar1 = (this->
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          ).bits;
  this_00 = (ProjectionLight *)(uVar1 & 0xffffffffffff);
  uVar2 = (ushort)(uVar1 >> 0x30);
  if (uVar1 >> 0x30 < 5) {
    if (uVar2 < 3) {
      if (uVar2 == 2) {
        DistantLight::SampleLe(__return_storage_ptr__,(DistantLight *)this_00,u1,u2,lambda,time);
      }
      else {
        PointLight::SampleLe(__return_storage_ptr__,(PointLight *)this_00,u1,u2,lambda,time);
      }
    }
    else if (uVar2 == 3) {
      ProjectionLight::SampleLe(__return_storage_ptr__,this_00,u1,u2,lambda,time);
    }
    else {
      GoniometricLight::SampleLe
                (__return_storage_ptr__,(GoniometricLight *)this_00,u1,u2,lambda,time);
    }
  }
  else if (uVar2 < 7) {
    if (uVar2 == 6) {
      DiffuseAreaLight::SampleLe
                (__return_storage_ptr__,(DiffuseAreaLight *)this_00,u1,u2,lambda,time);
    }
    else {
      SpotLight::SampleLe(__return_storage_ptr__,(SpotLight *)this_00,u1,u2,lambda,time);
    }
  }
  else if (uVar1 >> 0x30 == 8) {
    ImageInfiniteLight::SampleLe
              (__return_storage_ptr__,(ImageInfiniteLight *)this_00,u1,u2,lambda,time);
  }
  else if (uVar2 == 7) {
    UniformInfiniteLight::SampleLe
              (__return_storage_ptr__,(UniformInfiniteLight *)this_00,u1,u2,lambda,time);
  }
  else {
    PortalImageInfiniteLight::SampleLe
              (__return_storage_ptr__,(PortalImageInfiniteLight *)this_00,u1,u2,lambda,time);
  }
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightLeSample> LightHandle::SampleLe(Point2f u1, Point2f u2,
                                                    SampledWavelengths &lambda,
                                                    Float time) const {
    auto sample = [&](auto ptr) { return ptr->SampleLe(u1, u2, lambda, time); };
    return Dispatch(sample);
}